

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::VariablesQbIncrementPosition(ChNodeFEAxyzDD *this,double step)

{
  double dVar1;
  double dVar2;
  ChVector<double> newspeed_DD;
  ChVectorRef local_68;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_50 [56];
  
  ChNodeFEAxyzD::VariablesQbIncrementPosition(&this->super_ChNodeFEAxyzD,step);
  ChVariables::Get_qb(&local_68,*(ChVariables **)&(this->super_ChNodeFEAxyzD).field_0x138);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_50,&local_68,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&newspeed_DD,local_50,(type *)0x0);
  dVar1 = *(double *)&this->field_0x150;
  dVar2 = *(double *)&this->field_0x148;
  *(double *)&(this->super_ChNodeFEAxyzD).field_0x140 =
       step * newspeed_DD.m_data[0] + *(double *)&(this->super_ChNodeFEAxyzD).field_0x140;
  *(double *)&this->field_0x148 = step * newspeed_DD.m_data[1] + dVar2;
  *(double *)&this->field_0x150 = step * newspeed_DD.m_data[2] + dVar1;
  return;
}

Assistant:

void ChNodeFEAxyzDD::VariablesQbIncrementPosition(double step) {
    ChNodeFEAxyzD::VariablesQbIncrementPosition(step);

    ChVector<> newspeed_DD(variables_DD->Get_qb().segment(0, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    SetDD(GetDD() + newspeed_DD * step);
}